

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStruct<Js::AsmJsModuleInfo::ModuleVar>
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,ModuleVar *value)

{
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  Type TVar2;
  BufferBuilder *pBVar3;
  ImmutableList<Js::BufferBuilder_*> *pIVar4;
  
  pBVar3 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x30,this->alloc,0x364470);
  pBVar3->clue = clue;
  pBVar3->offset = 0xffffffff;
  pBVar3->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd988;
  TVar2 = value->initialiser;
  pBVar3[1]._vptr_BufferBuilder = *(_func_int ***)value;
  pBVar3[1].clue = (LPCWSTR)TVar2;
  *(undefined8 *)&pBVar3[1].offset = *(undefined8 *)&value->isMutable;
  pBVar3->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd968;
  pIVar1 = builder->list;
  pIVar4 = (ImmutableList<Js::BufferBuilder_*> *)
           new<Memory::ArenaAllocator>(0x10,this->alloc,0x364470);
  pIVar4->value = pBVar3;
  pIVar4->next = pIVar1;
  builder->list = pIVar4;
  return 0x18;
}

Assistant:

uint32 PrependStruct(BufferBuilderList & builder, LPCWSTR clue, TStructType * value)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<TStructType>, clue, *value);
        builder.list = builder.list->Prepend(entry, alloc);

        return sizeof(serialization_alignment TStructType);
    }